

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O2

void __thiscall
CDBBatch::Write<std::pair<unsigned_char,uint256>,CDiskBlockIndex>
          (CDBBatch *this,pair<unsigned_char,_uint256> *key,CDiskBlockIndex *value)

{
  DataStream *this_00;
  long lVar1;
  pointer pbVar2;
  long in_FS_OFFSET;
  Span<const_std::byte> key_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::reserve(&this->ssKey,0x40);
  this_00 = &this->ssValue;
  DataStream::reserve(this_00,0x400);
  Serialize<DataStream,unsigned_char,uint256>(&this->ssKey,key);
  CDiskBlockIndex::SerializationOps<DataStream,CDiskBlockIndex_const,ActionSerialize>(value,this_00)
  ;
  key_00.m_data =
       (this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
       _M_impl.super__Vector_impl_data._M_start + (this->ssKey).m_read_pos;
  key_00.m_size =
       (long)(this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)key_00.m_data;
  WriteImpl(this,key_00,this_00);
  pbVar2 = (this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
      .super__Vector_impl_data._M_finish != pbVar2) {
    (this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = pbVar2;
  }
  (this->ssKey).m_read_pos = 0;
  pbVar2 = (this->ssValue).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->ssValue).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
      _M_impl.super__Vector_impl_data._M_finish != pbVar2) {
    (this->ssValue).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
    .super__Vector_impl_data._M_finish = pbVar2;
  }
  (this->ssValue).m_read_pos = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Write(const K& key, const V& value)
    {
        ssKey.reserve(DBWRAPPER_PREALLOC_KEY_SIZE);
        ssValue.reserve(DBWRAPPER_PREALLOC_VALUE_SIZE);
        ssKey << key;
        ssValue << value;
        WriteImpl(ssKey, ssValue);
        ssKey.clear();
        ssValue.clear();
    }